

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BerdyHelper.cpp
# Opt level: O1

bool __thiscall
iDynTree::BerdyHelper::serializeDynamicVariables
          (BerdyHelper *this,LinkProperAccArray *properAccs,
          LinkNetTotalWrenchesWithoutGravity *netTotalWrenchesWithoutGrav,
          LinkNetExternalWrenches *netExtWrenches,LinkInternalWrenches *linkJointWrenches,
          JointDOFsDoubleArray *jointTorques,JointDOFsDoubleArray *jointAccs,VectorDynSize *d)

{
  BerdyVariants BVar1;
  
  BVar1 = (this->m_options).berdyVariant;
  if (BVar1 == BERDY_FLOATING_BASE_NON_COLLOCATED_EXT_WRENCHES) {
    serializeDynamicVariablesNonCollocatedWrenches(this,netExtWrenches,d);
  }
  else if (BVar1 == BERDY_FLOATING_BASE) {
    serializeDynamicVariablesFloatingBase
              (this,properAccs,netTotalWrenchesWithoutGrav,netExtWrenches,linkJointWrenches,
               jointTorques,jointAccs,d);
  }
  else {
    if (BVar1 != ORIGINAL_BERDY_FIXED_BASE) {
      iDynTree::reportError
                ("BerdyHelpers","serializeDynamicVariablesFixedBase","unknown berdy variant");
      return false;
    }
    serializeDynamicVariablesFixedBase
              (this,properAccs,netTotalWrenchesWithoutGrav,netExtWrenches,linkJointWrenches,
               jointTorques,jointAccs,d);
  }
  return true;
}

Assistant:

bool BerdyHelper::serializeDynamicVariables(LinkProperAccArray& properAccs,
                                                     LinkNetTotalWrenchesWithoutGravity& netTotalWrenchesWithoutGrav,
                                                     LinkNetExternalWrenches& netExtWrenches,
                                                     LinkInternalWrenches& linkJointWrenches,
                                                     JointDOFsDoubleArray& jointTorques,
                                                     JointDOFsDoubleArray& jointAccs,
                                                     VectorDynSize& d)
{
    bool res = false;
    switch(m_options.berdyVariant)
    {
        case ORIGINAL_BERDY_FIXED_BASE :
            res = serializeDynamicVariablesFixedBase(properAccs, netTotalWrenchesWithoutGrav, netExtWrenches, linkJointWrenches,
                                                     jointTorques, jointAccs, d);
            break;

        case BERDY_FLOATING_BASE :
            res = serializeDynamicVariablesFloatingBase(properAccs, netTotalWrenchesWithoutGrav, netExtWrenches,
                                                        linkJointWrenches, jointTorques, jointAccs, d);
            break;
        case BERDY_FLOATING_BASE_NON_COLLOCATED_EXT_WRENCHES:
            res = serializeDynamicVariablesNonCollocatedWrenches(netExtWrenches, d);
            break;
        default:
            reportError("BerdyHelpers", "serializeDynamicVariablesFixedBase", "unknown berdy variant");
            assert(false);
            res = false;
    }
    return res;
}